

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeprovider.cpp
# Opt level: O2

Type * __thiscall stackjit::TypeProvider::makeType(TypeProvider *this,string *name)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  mapped_type *ppTVar7;
  reference pvVar8;
  ClassType *this_00;
  Type *elementType;
  ClassMetadata *metadata;
  __hashtable *__h;
  TypeProvider *pTVar9;
  int iVar10;
  size_t i;
  long lVar11;
  ulong __n;
  PrimitiveTypes primitiveType;
  allocator local_141;
  TypeProvider *local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  typeParts;
  string className;
  long local_f0;
  long local_e8;
  string elementTypeName;
  string local_b0;
  string local_90;
  string local_70;
  long local_50;
  long local_48;
  
  sVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)this,name);
  if (sVar6 != 0) {
    ppTVar7 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this,name);
    return *ppTVar7;
  }
  local_140 = this;
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  className._M_dataplus._M_p = (pointer)&className.field_2;
  className._M_string_length = 0;
  className.field_2._M_local_buf[0] = '\0';
  typeParts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  typeParts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  typeParts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = false;
  for (lVar11 = 0; local_48 != lVar11; lVar11 = lVar11 + 1) {
    cVar1 = *(char *)(local_50 + lVar11);
    bVar5 = bVar4;
    if (cVar1 == '[') {
      bVar5 = true;
    }
    bVar3 = bVar4;
    if (cVar1 == ']') {
      bVar3 = false;
    }
    bVar2 = !bVar4;
    bVar4 = bVar3;
    if (bVar2) {
      bVar4 = bVar5;
    }
    if ((cVar1 != '.') || (bVar4)) {
      std::__cxx11::string::push_back((char)&className);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&typeParts,&className);
      std::__cxx11::string::assign((char *)&className);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&typeParts,&className);
  std::__cxx11::string::~string((string *)&className);
  std::__cxx11::string::~string((string *)&local_50);
  pvVar8 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&typeParts,0);
  pTVar9 = local_140;
  std::__cxx11::string::string((string *)&local_70,(string *)pvVar8);
  bVar4 = TypeSystem::fromString(&local_70,&primitiveType);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar4) {
    this_00 = (ClassType *)operator_new(0x28);
    PrimitiveType::PrimitiveType((PrimitiveType *)this_00,primitiveType);
LAB_00179edd:
    std::__cxx11::string::string((string *)&className,(string *)name);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,stackjit::Type_const*>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Type_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,stackjit::Type_const*>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,stackjit::Type_const*>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Type_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)pTVar9);
    std::__cxx11::string::~string((string *)&className);
  }
  else {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&typeParts,0);
    bVar4 = std::operator==(pvVar8,"Ref");
    if (bVar4) {
      elementTypeName._M_dataplus._M_p = (pointer)&elementTypeName.field_2;
      elementTypeName._M_string_length = 0;
      elementTypeName.field_2._M_local_buf[0] = '\0';
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&typeParts,1);
      std::__cxx11::string::string((string *)&local_f0,(string *)pvVar8);
      className._M_dataplus._M_p = (pointer)&className.field_2;
      className._M_string_length = 0;
      className.field_2._M_local_buf[0] = '\0';
      bVar4 = false;
      iVar10 = 0;
      for (lVar11 = 0; local_e8 != lVar11; lVar11 = lVar11 + 1) {
        cVar1 = *(char *)(local_f0 + lVar11);
        iVar10 = (iVar10 + (uint)(cVar1 == '[')) - (uint)(cVar1 == ']');
        if ((cVar1 == ']') && (iVar10 == 0)) {
          if (bVar4) {
            std::__cxx11::string::_M_assign((string *)&elementTypeName);
            std::__cxx11::string::~string((string *)&className);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::string((string *)&local_90,(string *)&elementTypeName);
            pTVar9 = local_140;
            elementType = makeType(local_140,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            if (elementType == (Type *)0x0) {
              this_00 = (ClassType *)0x0;
            }
            else {
              this_00 = (ClassType *)operator_new(0x30);
              ArrayType::ArrayType((ArrayType *)this_00,elementType);
            }
            goto LAB_00179ece;
          }
          break;
        }
        std::__cxx11::string::push_back((char)&className);
        bVar5 = std::operator==(&className,"Array[");
        if ((bVar5) && (!bVar4)) {
          className._M_string_length = 0;
          *className._M_dataplus._M_p = '\0';
          bVar4 = true;
        }
      }
      std::__cxx11::string::~string((string *)&className);
      std::__cxx11::string::~string((string *)&local_f0);
      __n = 1;
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&typeParts,1);
      bVar4 = std::operator==(pvVar8,"Null");
      if (bVar4) {
        this_00 = (ClassType *)operator_new(0x28);
        NullReferenceType::NullReferenceType((NullReferenceType *)this_00);
        pTVar9 = local_140;
      }
      else if ((ulong)((long)typeParts.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)typeParts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        this_00 = (ClassType *)0x0;
        pTVar9 = local_140;
      }
      else {
        std::__cxx11::string::string((string *)&className,"",&local_141);
        bVar4 = true;
        for (; pTVar9 = local_140,
            __n < (ulong)((long)typeParts.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)typeParts.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1) {
          if (!bVar4) {
            std::__cxx11::string::append((char *)&className);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at(&typeParts,__n);
          std::__cxx11::string::append((string *)&className);
          bVar4 = false;
        }
        bVar4 = ClassMetadataProvider::isDefined(local_140->mClassProvider,&className);
        if (bVar4) {
          this_00 = (ClassType *)operator_new(0x50);
          std::__cxx11::string::string((string *)&local_b0,(string *)&className);
          metadata = ClassMetadataProvider::getMetadata(pTVar9->mClassProvider,&className);
          ClassType::ClassType(this_00,&local_b0,metadata);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        else {
          this_00 = (ClassType *)0x0;
        }
        std::__cxx11::string::~string((string *)&className);
      }
LAB_00179ece:
      std::__cxx11::string::~string((string *)&elementTypeName);
      if (this_00 != (ClassType *)0x0) goto LAB_00179edd;
    }
    this_00 = (ClassType *)0x0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&typeParts);
  return (Type *)this_00;
}

Assistant:

const Type* TypeProvider::makeType(std::string name) {
		if (mTypes.count(name) > 0) {
			return mTypes[name];
		}

		//Split the type name
		auto typeParts = splitTypeName(name);
		Type* type = nullptr;

		PrimitiveTypes primitiveType;
		if (TypeSystem::fromString(typeParts.at(0), primitiveType)) {
			type = new PrimitiveType(primitiveType);
		} else if (typeParts.at(0) == "Ref") {
			std::string elementTypeName;
			if (extractElementType(typeParts.at(1), elementTypeName)) {
				auto elementType = makeType(elementTypeName);

				if (elementType != nullptr) {
					type = new ArrayType(elementType);
				}
			} else if (typeParts.at(1) == "Null") {
				type = new NullReferenceType();
			} else {
				if (typeParts.size() >= 2) {
					std::string className = "";
					bool isFirst = true;

					for (std::size_t i = 1; i < typeParts.size(); i++) {
						if (isFirst) {
							isFirst = false;
						} else {
							className += ".";
						}

						className += typeParts.at(i);
					}

					if (mClassProvider.isDefined(className)) {
						type = new ClassType(className, &mClassProvider.getMetadata(className));
					}
				}
			}
		}

		if (type != nullptr) {
			mTypes.insert({ name, type });
		}

		return type;
	}